

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncImport::~FuncImport(FuncImport *this)

{
  FuncImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import =
       (_func_int **)&PTR__FuncImport_01e53348;
  Func::~Func(&this->func);
  ImportMixin<(wabt::ExternalKind)0>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)0>);
  return;
}

Assistant:

explicit FuncImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Func>(), func(name) {}